

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas-calc.c
# Opt level: O2

void calc_free(borg_calculation *calc)

{
  void *p;
  borg_array *p_00;
  int i;
  long lVar1;
  
  p_00 = calc->token_array;
  if (p_00 != (borg_array *)0x0) {
    for (lVar1 = 0; lVar1 < p_00->count; lVar1 = lVar1 + 1) {
      p = p_00->items[lVar1];
      if (*(void **)((long)p + 8) != (void *)0x0) {
        mem_free(*(void **)((long)p + 8));
        *(undefined8 *)((long)p + 8) = 0;
      }
      mem_free(p);
      calc->token_array->items[lVar1] = (void *)0x0;
      p_00 = calc->token_array;
    }
    mem_free(p_00);
    calc->token_array = (borg_array *)0x0;
  }
  mem_free(calc);
  return;
}

Assistant:

static void calc_free(struct borg_calculation *calc)
{
    if (calc->token_array) {
        for (int i = 0; i < calc->token_array->count; i++) {
            token_free(calc->token_array->items[i]);
            calc->token_array->items[i] = NULL;
        }
        mem_free(calc->token_array);
        calc->token_array = NULL;
    }
    mem_free(calc);
    calc = NULL;
}